

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree_star_simplex_iterators.h
# Opt level: O3

void __thiscall
Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Low_options>_>::
Simplex_tree_optimized_star_simplex_iterator
          (Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Low_options>_> *this,
          Simplex_tree<Low_options> *cpx,Static_vertex_vector *simp)

{
  Simplex_tree<Low_options> *pSVar1;
  Simplex_tree<Low_options> *pSVar2;
  Siblings *pSVar3;
  Simplex_handle local_38;
  Siblings *local_30;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  local_28;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  local_20;
  
  this->st_ = cpx;
  Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Low_options>_>
  ::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator(&this->it_,cpx,simp);
  (this->end_).predicate_.cpx_ = (Simplex_tree<Low_options> *)0x0;
  (this->end_).predicate_.simp_.
  super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_40UL,_0UL,_true>,_void>
  .m_holder.m_size = 0;
  (this->end_).st_ = (Simplex_tree<Low_options> *)0x0;
  (this->end_).it_.super_type.m_iterator.members_.nodeptr_ = (list_node<void_*> *)0x0;
  (this->end_).it_.m_predicate.cpx_ = (Simplex_tree<Low_options> *)0x0;
  (this->end_).it_.m_predicate.simp_.
  super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_40UL,_0UL,_true>,_void>
  .m_holder.m_size = 0;
  (this->end_).it_.m_end.members_.nodeptr_ = (list_node<void_*> *)0x0;
  (this->end_).end_.super_type.m_iterator.members_.nodeptr_ = (list_node<void_*> *)0x0;
  (this->end_).end_.m_predicate.cpx_ = (Simplex_tree<Low_options> *)0x0;
  (this->end_).end_.m_predicate.simp_.
  super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_40UL,_0UL,_true>,_void>
  .m_holder.m_size = 0;
  (this->end_).end_.m_end.members_.nodeptr_ = (list_node<void_*> *)0x0;
  (this->end_).sh_.m_iit.members_.nodeptr_ = (compact_rbtree_node<void_*> *)0x0;
  pSVar1 = this->st_;
  local_20.m_iit.members_.nodeptr_ =
       (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
        )(this->it_).sh_.m_iit.members_.nodeptr_;
  (this->sh_).m_iit.members_.nodeptr_ =
       (compact_rbtree_node<void_*> *)local_20.m_iit.members_.nodeptr_;
  pSVar3 = Simplex_tree<Low_options>::
           self_siblings<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<unsigned_char_const,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>>>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,false>,true>>
                     (pSVar1,&local_20);
  this->sib_ = pSVar3;
  (this->children_stack_).
  super__Vector_base<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Low_options>,_boost::container::map<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>,_std::less<unsigned_char>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Low_options>,_boost::container::map<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>,_std::less<unsigned_char>,_void,_void>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children_stack_).
  super__Vector_base<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Low_options>,_boost::container::map<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>,_std::less<unsigned_char>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Low_options>,_boost::container::map<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>,_std::less<unsigned_char>,_void,_void>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children_stack_).
  super__Vector_base<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Low_options>,_boost::container::map<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>,_std::less<unsigned_char>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Low_options>,_boost::container::map<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>,_std::less<unsigned_char>,_void,_void>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar1 = (this->it_).st_;
  pSVar2 = (this->end_).st_;
  if (pSVar1 == (Simplex_tree<Low_options> *)0x0 || pSVar2 == (Simplex_tree<Low_options> *)0x0) {
    if (pSVar2 != (Simplex_tree<Low_options> *)0x0 || pSVar1 != (Simplex_tree<Low_options> *)0x0) {
LAB_00158891:
      this->is_root_ = true;
      pSVar1 = this->st_;
      local_28.m_iit.members_.nodeptr_ =
           (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
            )(this->it_).sh_.m_iit.members_.nodeptr_;
      (this->sh_).m_iit.members_.nodeptr_ =
           (compact_rbtree_node<void_*> *)local_28.m_iit.members_.nodeptr_;
      pSVar3 = Simplex_tree<Low_options>::
               self_siblings<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<unsigned_char_const,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>>>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,false>,true>>
                         (pSVar1,&local_28);
      this->sib_ = pSVar3;
      local_38.m_iit.members_.nodeptr_ =
           (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
            )(this->sh_).m_iit.members_.nodeptr_;
      if (local_38.m_iit.members_.nodeptr_ ==
          (iiterator_members<boost::intrusive::compact_rbtree_node<void_*>_*,_const_boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>_*,_false>
           )0x0) {
        __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                      "static pointer boost::intrusive::bhtraits_base<boost::container::dtl::tree_node<std::pair<const unsigned char, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>>>, void *, boost::container::red_black_tree, true>, boost::intrusive::compact_rbtree_node<void *> *, boost::intrusive::dft_tag, 3>::to_value_ptr(const node_ptr &) [T = boost::container::dtl::tree_node<std::pair<const unsigned char, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>>>, void *, boost::container::red_black_tree, true>, NodePtr = boost::intrusive::compact_rbtree_node<void *> *, Tag = boost::intrusive::dft_tag, Type = 3]"
                     );
      }
      if (*(char *)&(*(node_ptr *)((long)local_38.m_iit.members_.nodeptr_ + 0x38))->left_ !=
          *(char *)&((compact_rbtree_node<void_*> *)((long)local_38.m_iit.members_.nodeptr_ + 0x18))
                    ->parent_) {
        return;
      }
      local_30 = Simplex_tree<Low_options>::children(this->st_,&local_38);
      std::
      vector<Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Low_options>,boost::container::map<unsigned_char,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>>,std::less<unsigned_char>,void,void>>const*,std::allocator<Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Low_options>,boost::container::map<unsigned_char,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>>,std::less<unsigned_char>,void,void>>const*>>
      ::
      emplace_back<Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Low_options>,boost::container::map<unsigned_char,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>>,std::less<unsigned_char>,void,void>>const*>
                ((vector<Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Low_options>,boost::container::map<unsigned_char,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>>,std::less<unsigned_char>,void,void>>const*,std::allocator<Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Low_options>,boost::container::map<unsigned_char,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>>,std::less<unsigned_char>,void,void>>const*>>
                  *)&this->children_stack_,&local_30);
      return;
    }
  }
  else if ((this->it_).it_.super_type.m_iterator.members_.nodeptr_ !=
           (this->end_).it_.super_type.m_iterator.members_.nodeptr_) goto LAB_00158891;
  this->st_ = (Simplex_tree<Low_options> *)0x0;
  return;
}

Assistant:

Simplex_tree_optimized_star_simplex_iterator(SimplexTree const* cpx, Static_vertex_vector&& simp)
      : st_(cpx), it_(cpx, std::move(simp)), end_(), sh_(*it_), sib_(st_->self_siblings(sh_)), children_stack_() {
    if (it_ == end_) {
      st_ = nullptr;
      return;
    }  // no coface subtree => end()
    is_root_ = true;
    sh_ = *it_;                      // sh_ is the root
    sib_ = st_->self_siblings(sh_);  // Siblings containing sh_
    if (st_->has_children(sh_)) {
      children_stack_.push_back(st_->children(sh_));
    }
    return;  // first root of coface subtree
  }